

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.h
# Opt level: O3

void __thiscall BezierCurve::ConvertToGeographic(BezierCurve *this,ptTy *pt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = pt->x;
  if ((!NAN(dVar1)) && (!NAN(pt->y))) {
    dVar3 = (this->start)._lat;
    pt->y = pt->y / 111132.95 + dVar3;
    dVar2 = (this->start)._lon;
    dVar3 = cos(((double)(~-(ulong)(dVar3 <= 180.0) & (ulong)(dVar3 + -360.0) |
                         (ulong)dVar3 & -(ulong)(dVar3 <= 180.0)) * 3.141592653589793) / 180.0);
    pt->x = dVar1 / (dVar3 * 111132.95) + dVar2;
  }
  return;
}

Assistant:

void clear() { x = y = NAN; }